

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O1

void VxSndInit(void)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  undefined4 uVar4;
  ALCdevice *file_name;
  ALCdevice *pAVar5;
  long lVar6;
  ALCdevice *unaff_RBX;
  undefined4 *in_RSI;
  undefined4 uVar7;
  float fVar8;
  undefined4 uStack_5c;
  mp3dec_file_info_t mStack_58;
  ALCdevice *pAStack_38;
  
  file_name = (ALCdevice *)alcOpenDevice(0);
  device = file_name;
  if (file_name == (ALCdevice *)0x0) {
    VxSndInit_cold_2();
  }
  else {
    in_RSI = (undefined4 *)0x0;
    pAVar5 = (ALCdevice *)alcCreateContext();
    if (pAVar5 == (ALCdevice *)0x0) goto LAB_00149a14;
    cVar2 = alcMakeContextCurrent(pAVar5);
    unaff_RBX = pAVar5;
    if (cVar2 != '\0') {
      cVar2 = alcIsExtensionPresent(device,"ALC_ENUMERATE_ALL_EXT");
      if (cVar2 == '\0') {
        lVar6 = 0;
      }
      else {
        lVar6 = alcGetString(device,0x1013);
      }
      if (lVar6 != 0) {
        iVar3 = alcGetError(device);
        if (iVar3 == 0) goto LAB_001499f5;
      }
      lVar6 = alcGetString(device,0x1005);
LAB_001499f5:
      printf("Successfully initialized sound! Device name: %s\n",lVar6);
      return;
    }
  }
  file_name = unaff_RBX;
  alcDestroyContext();
LAB_00149a14:
  VxSndInit_cold_1();
  pAStack_38 = unaff_RBX;
  iVar3 = mp3dec_load(&mp3Dec,(char *)file_name,&mStack_58,(MP3D_PROGRESS_CB)0x0,(void *)0x0);
  if (iVar3 == 0) {
    uVar1 = (int)mStack_58.samples * 2;
    uVar4 = 0x1103;
    if ((char)mStack_58.channels != '\x02') {
      uVar4 = 0;
    }
    uVar7 = 0x1101;
    if ((char)mStack_58.channels != '\x01') {
      uVar7 = uVar4;
    }
    fVar8 = (float)uVar1 / ((float)mStack_58.avg_bitrate_kbps * 1024.0);
    alGenBuffers(1,&uStack_5c);
    alBufferData(uStack_5c,uVar7,mStack_58.buffer,uVar1,mStack_58.hz);
    *in_RSI = uStack_5c;
    *(undefined1 *)(in_RSI + 2) = 1;
    in_RSI[3] = fVar8;
    alGenSources(1,in_RSI + 1);
    alSourcei(in_RSI[1],0x1009,uStack_5c);
    puts("Loaded mp3 info:");
    printf("    Filename: %s\n",file_name);
    printf("    Channels: %d\n",(ulong)(uint)mStack_58.channels);
    printf("    Sample Rate: %d\n",(ulong)(uint)mStack_58.hz);
    printf("    Size: %d bytes\n",(ulong)uVar1);
    printf("    Length: %f sec\n",(double)fVar8);
    iVar3 = alGetError();
    if (iVar3 != 0) {
      VxSndLoadSound_cold_1();
    }
  }
  else {
    fprintf(_stderr,"Can\'t load %s!\n",file_name);
    *(undefined1 *)(in_RSI + 2) = 0;
  }
  return;
}

Assistant:

void VxSndInit() {
    ALCcontext* context;
    device = alcOpenDevice(NULL);

    if (!device) {
        fprintf(stderr, "Can't open audio device!\n");
        exit(EXIT_FAILURE);
    }

    context = alcCreateContext(device, NULL);
    if (context == NULL || alcMakeContextCurrent(context) == ALC_FALSE) {
        if (context != NULL)
            alcDestroyContext(context);
        alcCloseDevice(device);
        fprintf(stderr, "Could not set a context!\n");
        exit(EXIT_FAILURE);
    }

    const char* name = NULL;
    if (alcIsExtensionPresent(device, "ALC_ENUMERATE_ALL_EXT"))
        name = alcGetString(device, ALC_ALL_DEVICES_SPECIFIER);
    if (!name || alcGetError(device) != AL_NO_ERROR)
        name = alcGetString(device, ALC_DEVICE_SPECIFIER);

    printf("Successfully initialized sound! Device name: %s\n", name);
}